

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBinFromStdio::load(Mat *__return_storage_ptr__,ModelBinFromStdio *this,int w,int type)

{
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  pointer puVar5;
  size_t sVar6;
  pointer puVar7;
  char *pcVar8;
  ulong uVar9;
  size_type __new_size;
  anon_union_4_2_77b30072 flag_struct;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  void *ptr;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  uint local_4ac;
  size_t local_4a8;
  uint local_49c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_498;
  pointer local_478;
  pointer puStack_470;
  undefined8 local_468;
  undefined4 local_460;
  long *local_458;
  undefined4 local_450;
  int local_44c;
  undefined8 local_448;
  size_t local_440;
  vector<signed_char,_std::allocator<signed_char>_> local_438 [43];
  
  if ((FILE *)this->binfp == (FILE *)0x0) {
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    goto LAB_001193e0;
  }
  if (type == 1) {
    sVar6 = (size_t)w;
    if (w == 0) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->packing = 1;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = sVar6;
      return __return_storage_ptr__;
    }
    local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    iVar3 = posix_memalign((void **)local_438,0x10,sVar6 * 4 + 4);
    puVar7 = (pointer)0x0;
    if (iVar3 == 0) {
      puVar7 = (pointer)local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    }
    puVar5 = puVar7 + sVar6 * 2;
    puVar5[0] = 1;
    puVar5[1] = 0;
    sVar4 = fread(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                  .super__Vector_impl_data._M_start,sVar6 * 4,1,(FILE *)this->binfp);
    if ((int)sVar4 == 1) {
      __return_storage_ptr__->data = puVar7;
      __return_storage_ptr__->refcount = (int *)puVar5;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->packing = 1;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = sVar6;
      LOCK();
      *(int *)(puVar7 + sVar6 * 2) = *(int *)(puVar7 + sVar6 * 2) + 1;
      UNLOCK();
    }
    else {
      fprintf(_stderr,"ModelBin read weight_data failed %d\n",sVar4 & 0xffffffff);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
    }
    LOCK();
    *(int *)puVar5 = *(int *)puVar5 + -1;
    iVar3 = *(int *)puVar5;
    UNLOCK();
joined_r0x00119494:
    if (iVar3 != 0) {
      return __return_storage_ptr__;
    }
    goto LAB_0011949d;
  }
  if (type == 0) {
    sVar4 = fread(&local_4ac,4,1,(FILE *)this->binfp);
    if ((int)sVar4 == 1) {
      if (local_4ac == 0x2c056) {
        sVar6 = (size_t)w;
        if (w == 0) {
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          __return_storage_ptr__->elemsize = 4;
          __return_storage_ptr__->packing = 1;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 1;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 1;
          __return_storage_ptr__->c = 1;
          __return_storage_ptr__->cstep = sVar6;
          return __return_storage_ptr__;
        }
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        iVar3 = posix_memalign((void **)local_438,0x10,sVar6 * 4 + 4);
        puVar7 = (pointer)0x0;
        if (iVar3 == 0) {
          puVar7 = (pointer)local_438[0].
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start;
        }
        puVar5 = puVar7 + sVar6 * 2;
        puVar5[0] = 1;
        puVar5[1] = 0;
        sVar4 = fread(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,sVar6 * 4,1,(FILE *)this->binfp);
        if ((int)sVar4 == 1) {
          __return_storage_ptr__->data = puVar7;
          __return_storage_ptr__->refcount = (int *)puVar5;
          __return_storage_ptr__->elemsize = 4;
          __return_storage_ptr__->packing = 1;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 1;
          __return_storage_ptr__->w = w;
          __return_storage_ptr__->h = 1;
          __return_storage_ptr__->c = 1;
          __return_storage_ptr__->cstep = sVar6;
          LOCK();
          *(int *)(puVar7 + sVar6 * 2) = *(int *)(puVar7 + sVar6 * 2) + 1;
          UNLOCK();
        }
        else {
          fprintf(_stderr,"ModelBin read weight_data failed %d\n",sVar4 & 0xffffffff);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
        }
        LOCK();
        *(int *)puVar5 = *(int *)puVar5 + -1;
        iVar3 = *(int *)puVar5;
        UNLOCK();
        goto joined_r0x00119494;
      }
      if (local_4ac == 0xd4b38) {
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar9 = (long)(w + 3) & 0xfffffffffffffffc;
        std::vector<signed_char,_std::allocator<signed_char>_>::resize(local_438,uVar9);
        sVar4 = fread(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,uVar9,1,(FILE *)this->binfp);
        uVar2 = (uint)sVar4;
        if (uVar2 == 1) {
          sVar4 = (size_t)w;
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          __return_storage_ptr__->elemsize = 1;
          __return_storage_ptr__->packing = 1;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 1;
          __return_storage_ptr__->w = w;
          __return_storage_ptr__->h = 1;
          __return_storage_ptr__->c = 1;
          __return_storage_ptr__->cstep = sVar4;
          if (w != 0) {
            uVar9 = sVar4 + 3 & 0xfffffffffffffffc;
            local_478 = (pointer)0x0;
            iVar3 = posix_memalign(&local_478,0x10,uVar9 + 4);
            puVar7 = (pointer)0x0;
            if (iVar3 == 0) {
              puVar7 = local_478;
            }
            __return_storage_ptr__->data = puVar7;
            __return_storage_ptr__->refcount = (int *)((long)puVar7 + uVar9);
            pcVar1 = (pointer)((long)puVar7 + uVar9);
            pcVar1[0] = '\x01';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0) {
              memcpy(local_478,
                     local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar4);
            }
          }
          goto LAB_00119948;
        }
        pcVar8 = "ModelBin read int8_weights failed %d\n";
      }
      else {
        if (local_4ac != 0x1306b47) {
          local_478 = (pointer)0x0;
          puStack_470 = (pointer)0x0;
          local_468 = 4;
          local_460 = 1;
          local_458 = (long *)0x0;
          local_450 = 1;
          local_448 = 0x100000001;
          local_440 = (size_t)w;
          local_44c = w;
          if (w == 0) {
            __return_storage_ptr__->data = (void *)0x0;
            __return_storage_ptr__->refcount = (int *)0x0;
            __return_storage_ptr__->elemsize = 4;
            __return_storage_ptr__->packing = 1;
            __return_storage_ptr__->allocator = (Allocator *)0x0;
            __return_storage_ptr__->dims = 1;
            __return_storage_ptr__->w = 0;
            __return_storage_ptr__->h = 1;
            __return_storage_ptr__->c = 1;
            __return_storage_ptr__->cstep = local_440;
          }
          else {
            local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_4a8 = local_440;
            local_49c = local_4ac >> 0x18;
            iVar3 = posix_memalign((void **)local_438,0x10,local_440 * 4 + 4);
            puVar7 = (pointer)0x0;
            if (iVar3 == 0) {
              puVar7 = (pointer)local_438[0].
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
            }
            puVar5 = puVar7 + local_4a8 * 2;
            puVar5[0] = 1;
            puVar5[1] = 0;
            local_478 = puVar7;
            puStack_470 = puVar5;
            if ((local_4ac >> 8 & 0xff) + (local_4ac & 0xff) + (local_4ac >> 0x10 & 0xff) == 0 &&
                local_49c == 0) {
              if ((char)local_4ac == '\0') {
                sVar4 = fread(local_438[0].
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start,local_4a8 * 4,1,(FILE *)this->binfp);
                uVar2 = (uint)sVar4;
                if (uVar2 != 1) {
                  pcVar8 = "ModelBin read weight_data failed %d\n";
                  goto LAB_001199b0;
                }
              }
            }
            else {
              sVar4 = fread(local_438,0x400,1,(FILE *)this->binfp);
              uVar2 = (uint)sVar4;
              if (uVar2 != 1) {
                pcVar8 = "ModelBin read quantization_value failed %d\n";
LAB_001199b0:
                fprintf(_stderr,pcVar8,(ulong)uVar2);
                __return_storage_ptr__->data = (void *)0x0;
                __return_storage_ptr__->refcount = (int *)0x0;
                *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                __return_storage_ptr__->allocator = (Allocator *)0x0;
                __return_storage_ptr__->dims = 0;
                __return_storage_ptr__->w = 0;
                __return_storage_ptr__->h = 0;
                __return_storage_ptr__->c = 0;
                __return_storage_ptr__->cstep = 0;
                goto LAB_00119a5f;
              }
              local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              __new_size = (size_type)(int)(w + 3U & 0xfffffffc);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_498,__new_size);
              sVar4 = fread(local_498.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,__new_size,1,
                            (FILE *)this->binfp);
              if ((int)sVar4 == 1) {
                if (w < 1) goto LAB_00119a02;
                uVar9 = 0;
                do {
                  *(undefined4 *)(puVar7 + uVar9 * 2) =
                       *(undefined4 *)
                        ((long)&local_438[0].
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                        (ulong)local_498.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar9] * 4);
                  uVar9 = uVar9 + 1;
                } while ((uint)w != uVar9);
LAB_00119a07:
                operator_delete(local_498.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_498.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_498.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              else {
                fprintf(_stderr,"ModelBin read index_array failed %d\n",sVar4 & 0xffffffff);
                __return_storage_ptr__->data = (void *)0x0;
                __return_storage_ptr__->refcount = (int *)0x0;
                *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                __return_storage_ptr__->allocator = (Allocator *)0x0;
                __return_storage_ptr__->dims = 0;
                __return_storage_ptr__->w = 0;
                __return_storage_ptr__->h = 0;
                __return_storage_ptr__->c = 0;
                __return_storage_ptr__->cstep = 0;
LAB_00119a02:
                if (local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_00119a07;
              }
              if ((int)sVar4 != 1) goto LAB_00119a5f;
            }
            __return_storage_ptr__->data = puVar7;
            __return_storage_ptr__->refcount = (int *)puVar5;
            __return_storage_ptr__->elemsize = 4;
            __return_storage_ptr__->packing = 1;
            __return_storage_ptr__->allocator = (Allocator *)0x0;
            __return_storage_ptr__->dims = 1;
            __return_storage_ptr__->w = w;
            __return_storage_ptr__->h = 1;
            __return_storage_ptr__->c = 1;
            __return_storage_ptr__->cstep = local_4a8;
            LOCK();
            *(int *)(puVar7 + local_4a8 * 2) = *(int *)(puVar7 + local_4a8 * 2) + 1;
            UNLOCK();
          }
LAB_00119a5f:
          if (puStack_470 == (pointer)0x0) {
            return __return_storage_ptr__;
          }
          LOCK();
          *(int *)puStack_470 = *(int *)puStack_470 + -1;
          UNLOCK();
          if (*(int *)puStack_470 != 0) {
            return __return_storage_ptr__;
          }
          if (local_458 != (long *)0x0) {
            (**(code **)(*local_458 + 0x18))();
            return __return_storage_ptr__;
          }
          puVar7 = local_478;
          if (local_478 == (pointer)0x0) {
            return __return_storage_ptr__;
          }
LAB_0011949d:
          free(puVar7);
          return __return_storage_ptr__;
        }
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar9 = (long)(((ulong)(uint)w << 0x21) + 0x300000000) >> 0x20 & 0xfffffffffffffffc;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_438,uVar9);
        sVar4 = fread(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,uVar9,1,(FILE *)this->binfp);
        uVar2 = (uint)sVar4;
        if (uVar2 == 1) {
          Mat::from_float16(__return_storage_ptr__,
                            (unsigned_short *)
                            local_438[0].
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start,w);
          goto LAB_00119948;
        }
        pcVar8 = "ModelBin read float16_weights failed %d\n";
      }
      fprintf(_stderr,pcVar8,(ulong)uVar2);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
LAB_00119948:
      if ((unsigned_short *)
          local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start == (unsigned_short *)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_438[0].
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_438[0].
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
    pcVar8 = "ModelBin read flag_struct failed %d\n";
    uVar9 = sVar4 & 0xffffffff;
  }
  else {
    pcVar8 = "ModelBin load type %d not implemented\n";
    uVar9 = (ulong)(uint)type;
  }
  fprintf(_stderr,pcVar8,uVar9);
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
LAB_001193e0:
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromStdio::load(int w, int type) const
{
    if (!binfp)
        return Mat();

    if (type == 0)
    {
        int nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = fread(&flag_struct, sizeof(flag_struct), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read flag_struct failed %d\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            int align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = fread(float16_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %d\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            int align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = fread(int8_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %d\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = fread(quantization_value, 256 * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read quantization_value failed %d\n", nread);
                return Mat();
            }

            int align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = fread(index_array.data(), align_weight_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read index_array failed %d\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        int nread = fread(m, w * sizeof(float), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}